

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O3

void __thiscall Liby::FileDescriptor::set_noblock(FileDescriptor *this,bool flag)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  char *pcVar5;
  
  uVar1 = fcntl(this->fd_,3);
  if (-1 < (int)uVar1) {
    iVar2 = fcntl(this->fd_,4,(ulong)((uint)flag << 0xb | uVar1 & 0x7ffff7ff));
    if (-1 < iVar2) {
      return;
    }
  }
  piVar3 = __errno_location();
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar5 = strerror(*piVar3);
  *puVar4 = pcVar5;
  __cxa_throw(puVar4,&char*::typeinfo,0);
}

Assistant:

void Liby::FileDescriptor::set_noblock(bool flag) {
    int opt;
    opt = ::fcntl(fd_, F_GETFL);
    if (opt < 0) {
        throw_err();
    }
    opt = flag ? (opt | O_NONBLOCK) : (opt & ~O_NONBLOCK);
    if (::fcntl(fd_, F_SETFL, opt) < 0) {
        throw_err();
    }
}